

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

Ptr __thiscall core::image::load_ppm_file(image *this,string *filename)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Ptr PVar2;
  undefined1 auVar3 [16];
  Ptr PVar4;
  long local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  PVar2 = load_ppm_file_intern((image *)&local_28,filename,true);
  _Var1 = PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_28 != 0) {
    auVar3 = __dynamic_cast(local_28,&ImageBase::typeinfo,&Image<unsigned_char>::typeinfo,0);
    _Var1._M_pi = auVar3._8_8_;
    if (auVar3._0_8_ != 0) {
      *(long *)this = auVar3._0_8_;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_20;
      if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_20->_M_use_count = local_20->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_20->_M_use_count = local_20->_M_use_count + 1;
        }
      }
      goto LAB_0010ef67;
    }
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
LAB_0010ef67:
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var1._M_pi = extraout_RDX;
  }
  PVar4.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  PVar4.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar4.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ByteImage::Ptr
load_ppm_file (std::string const& filename)
{
    return std::dynamic_pointer_cast<ByteImage>
        (load_ppm_file_intern(filename, true));
}